

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::PeriodicTask::PostNextTask(PeriodicTask *this)

{
  uint32_t uVar1;
  uint uVar2;
  TaskRunner *pTVar3;
  rep rVar4;
  type local_70;
  function<void_()> local_50;
  undefined1 local_30 [8];
  WeakPtr<perfetto::base::PeriodicTask> weak_this;
  uint32_t delay_ms;
  PeriodicTask *this_local;
  
  uVar1 = (this->args_).period_ms;
  weak_this.handle_.super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)GetWallTimeMs();
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000L>_> *)
                     &weak_this.handle_.
                      super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  uVar2 = (this->args_).period_ms;
  WeakPtrFactory<perfetto::base::PeriodicTask>::GetWeakPtr
            ((WeakPtrFactory<perfetto::base::PeriodicTask> *)local_30);
  pTVar3 = this->task_runner_;
  ::std::
  bind<void(&)(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int),perfetto::base::WeakPtr<perfetto::base::PeriodicTask>&,unsigned_int&>
            (&local_70,RunTaskAndPostNext,(WeakPtr<perfetto::base::PeriodicTask> *)local_30,
             &this->generation_);
  ::std::function<void()>::
  function<std::_Bind<void(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,unsigned_int)>,void>
            ((function<void()> *)&local_50,&local_70);
  (*pTVar3->_vptr_TaskRunner[3])
            (pTVar3,&local_50,(ulong)(uVar1 - (int)(rVar4 % (long)(ulong)uVar2)));
  ::std::function<void_()>::~function(&local_50);
  std::
  _Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>
  ::~_Bind(&local_70);
  WeakPtr<perfetto::base::PeriodicTask>::~WeakPtr((WeakPtr<perfetto::base::PeriodicTask> *)local_30)
  ;
  return;
}

Assistant:

void PeriodicTask::PostNextTask() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DCHECK(args_.period_ms > 0);
  PERFETTO_DCHECK(!timer_fd_);
  uint32_t delay_ms =
      args_.period_ms -
      static_cast<uint32_t>(base::GetWallTimeMs().count() % args_.period_ms);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostDelayedTask(
      std::bind(PeriodicTask::RunTaskAndPostNext, weak_this, generation_),
      delay_ms);
}